

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O3

void __thiscall
icu_63::MaybeStackArray<char16_t,_4>::MaybeStackArray
          (MaybeStackArray<char16_t,_4> *this,int32_t newCapacity)

{
  char16_t *pcVar1;
  
  this->ptr = this->stackArray;
  this->capacity = 4;
  this->needToRelease = '\0';
  if (4 < newCapacity) {
    pcVar1 = (char16_t *)uprv_malloc_63((ulong)(uint)(newCapacity * 2));
    if (pcVar1 != (char16_t *)0x0) {
      if (this->needToRelease != '\0') {
        uprv_free_63(this->ptr);
      }
      this->ptr = pcVar1;
      this->capacity = newCapacity;
      this->needToRelease = '\x01';
    }
  }
  return;
}

Assistant:

MaybeStackArray() : ptr(stackArray), capacity(stackCapacity), needToRelease(FALSE) {}